

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  byte bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined4 uVar67;
  undefined1 auVar68 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined4 uVar75;
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar5 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar26 = sVar8 * uVar5;
  lVar25 = sVar8 * (uVar5 + 1);
  pBVar6 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar9 = (pBVar6->super_RawBufferView).ptr_ofs;
  sVar8 = (pBVar6->super_RawBufferView).stride;
  lVar21 = uVar5 * sVar8;
  lVar24 = sVar8 * (uVar5 + 1);
  aVar2 = (space->vx).field_0;
  aVar3 = (space->vy).field_0;
  aVar4 = (space->vz).field_0;
  uVar67 = *(undefined4 *)(pcVar7 + lVar26 + 8);
  auVar27._4_4_ = uVar67;
  auVar27._0_4_ = uVar67;
  auVar27._8_4_ = uVar67;
  auVar27._12_4_ = uVar67;
  auVar27 = vmulps_avx512vl((undefined1  [16])aVar4,auVar27);
  uVar67 = *(undefined4 *)(pcVar7 + lVar26 + 4);
  auVar29._4_4_ = uVar67;
  auVar29._0_4_ = uVar67;
  auVar29._8_4_ = uVar67;
  auVar29._12_4_ = uVar67;
  auVar27 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar3,auVar29);
  uVar67 = *(undefined4 *)(pcVar7 + lVar26);
  auVar31._4_4_ = uVar67;
  auVar31._0_4_ = uVar67;
  auVar31._8_4_ = uVar67;
  auVar31._12_4_ = uVar67;
  auVar28 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar2,auVar31);
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar12 = fVar1 * *(float *)(pcVar7 + lVar26 + 0xc);
  uVar67 = *(undefined4 *)(pcVar7 + lVar25 + 8);
  auVar32._4_4_ = uVar67;
  auVar32._0_4_ = uVar67;
  auVar32._8_4_ = uVar67;
  auVar32._12_4_ = uVar67;
  auVar27 = vmulps_avx512vl((undefined1  [16])aVar4,auVar32);
  uVar67 = *(undefined4 *)(pcVar7 + lVar25 + 4);
  auVar30._4_4_ = uVar67;
  auVar30._0_4_ = uVar67;
  auVar30._8_4_ = uVar67;
  auVar30._12_4_ = uVar67;
  auVar29 = vfmadd231ps_avx512vl(auVar27,(undefined1  [16])aVar3,auVar30);
  auVar27 = vinsertps_avx(auVar28,ZEXT416((uint)fVar12),0x30);
  uVar67 = *(undefined4 *)(pcVar7 + lVar25);
  auVar14._4_4_ = uVar67;
  auVar14._0_4_ = uVar67;
  auVar14._8_4_ = uVar67;
  auVar14._12_4_ = uVar67;
  auVar30 = vfmadd231ps_avx512vl(auVar29,(undefined1  [16])aVar2,auVar14);
  fVar13 = fVar1 * *(float *)(pcVar7 + lVar25 + 0xc);
  auVar29 = vinsertps_avx(auVar30,ZEXT416((uint)fVar13),0x30);
  uVar67 = *(undefined4 *)(pcVar9 + lVar21 + 8);
  auVar37._4_4_ = uVar67;
  auVar37._0_4_ = uVar67;
  auVar37._8_4_ = uVar67;
  auVar37._12_4_ = uVar67;
  auVar31 = vmulps_avx512vl((undefined1  [16])aVar4,auVar37);
  uVar67 = *(undefined4 *)(pcVar9 + lVar21 + 4);
  auVar38._4_4_ = uVar67;
  auVar38._0_4_ = uVar67;
  auVar38._8_4_ = uVar67;
  auVar38._12_4_ = uVar67;
  auVar31 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar3,auVar38);
  uVar67 = *(undefined4 *)(pcVar9 + lVar21);
  auVar33._4_4_ = uVar67;
  auVar33._0_4_ = uVar67;
  auVar33._8_4_ = uVar67;
  auVar33._12_4_ = uVar67;
  auVar31 = vfmadd231ps_avx512vl(auVar31,(undefined1  [16])aVar2,auVar33);
  uVar67 = *(undefined4 *)(pcVar9 + lVar24 + 8);
  auVar34._4_4_ = uVar67;
  auVar34._0_4_ = uVar67;
  auVar34._8_4_ = uVar67;
  auVar34._12_4_ = uVar67;
  auVar32 = vmulps_avx512vl((undefined1  [16])aVar4,auVar34);
  uVar67 = *(undefined4 *)(pcVar9 + lVar24 + 4);
  auVar35._4_4_ = uVar67;
  auVar35._0_4_ = uVar67;
  auVar35._8_4_ = uVar67;
  auVar35._12_4_ = uVar67;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar3,auVar35);
  auVar31 = vinsertps_avx(auVar31,ZEXT416((uint)(fVar1 * *(float *)(pcVar9 + lVar21 + 0xc))),0x30);
  uVar67 = *(undefined4 *)(pcVar9 + lVar24);
  auVar36._4_4_ = uVar67;
  auVar36._0_4_ = uVar67;
  auVar36._8_4_ = uVar67;
  auVar36._12_4_ = uVar67;
  auVar32 = vfmadd231ps_avx512vl(auVar32,(undefined1  [16])aVar2,auVar36);
  auVar32 = vinsertps_avx(auVar32,ZEXT416((uint)(fVar1 * *(float *)(pcVar9 + lVar24 + 0xc))),0x30);
  auVar72._8_4_ = 0xbeaaaaab;
  auVar72._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar72._12_4_ = 0xbeaaaaab;
  auVar31 = vfnmadd213ps_fma(auVar31,auVar72,auVar27);
  auVar27 = vfmadd213ps_fma(auVar32,auVar72,auVar29);
  uVar5 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          tessellationRate;
  uVar22 = (ulong)uVar5;
  uVar67 = auVar28._0_4_;
  uVar75 = auVar31._0_4_;
  if (uVar22 == 4) {
    auVar73._4_4_ = uVar67;
    auVar73._0_4_ = uVar67;
    auVar73._8_4_ = uVar67;
    auVar73._12_4_ = uVar67;
    auVar32 = vshufps_avx(auVar28,auVar28,0x55);
    auVar14 = vshufps_avx(auVar28,auVar28,0xaa);
    auVar70._4_4_ = fVar12;
    auVar70._0_4_ = fVar12;
    auVar70._8_4_ = fVar12;
    auVar70._12_4_ = fVar12;
    auVar77._4_4_ = uVar75;
    auVar77._0_4_ = uVar75;
    auVar77._8_4_ = uVar75;
    auVar77._12_4_ = uVar75;
    auVar37 = vshufps_avx(auVar31,auVar31,0x55);
    auVar38 = vshufps_avx(auVar31,auVar31,0xaa);
    auVar31 = vshufps_avx(auVar31,auVar31,0xff);
    uVar67 = auVar27._0_4_;
    auVar80._4_4_ = uVar67;
    auVar80._0_4_ = uVar67;
    auVar80._8_4_ = uVar67;
    auVar80._12_4_ = uVar67;
    auVar33 = vshufps_avx512vl(auVar27,auVar27,0x55);
    auVar34 = vshufps_avx512vl(auVar27,auVar27,0xaa);
    auVar27 = vshufps_avx(auVar27,auVar27,0xff);
    auVar35 = vbroadcastss_avx512vl(auVar30);
    auVar36 = vshufps_avx512vl(auVar30,auVar30,0x55);
    auVar30 = vshufps_avx(auVar30,auVar30,0xaa);
    auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)fVar13));
    auVar35 = vmulps_avx512vl(auVar35,bezier_basis0._3740_16_);
    auVar36 = vmulps_avx512vl(auVar36,bezier_basis0._3740_16_);
    auVar30 = vmulps_avx512vl(auVar30,bezier_basis0._3740_16_);
    auVar28 = vmulps_avx512vl(auVar28,bezier_basis0._3740_16_);
    auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2584_16_,auVar80);
    auVar33 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2584_16_,auVar33);
    auVar30 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._2584_16_,auVar34);
    auVar34 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._2584_16_,auVar27);
    auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._1428_16_,auVar77);
    auVar37 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._1428_16_,auVar37);
    auVar27 = vfmadd231ps_fma(auVar30,bezier_basis0._1428_16_,auVar38);
    auVar31 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._1428_16_,auVar31);
    auVar38 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._272_16_,auVar73);
    auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._272_16_,auVar32);
    auVar14 = vfmadd231ps_fma(auVar27,bezier_basis0._272_16_,auVar14);
    auVar33 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._272_16_,auVar70);
    auVar34 = vshufps_avx512vl(auVar38,auVar38,0xb1);
    auVar31 = vminps_avx512vl(auVar34,auVar38);
    auVar27 = vshufpd_avx(auVar31,auVar31,1);
    auVar27 = vminps_avx(auVar27,auVar31);
    auVar35 = vshufps_avx512vl(auVar37,auVar37,0xb1);
    auVar32 = vminps_avx512vl(auVar35,auVar37);
    auVar31 = vshufpd_avx(auVar32,auVar32,1);
    auVar31 = vminps_avx(auVar31,auVar32);
    auVar27 = vinsertps_avx(auVar27,auVar31,0x1c);
    auVar30 = vshufps_avx(auVar14,auVar14,0xb1);
    auVar31 = vminps_avx(auVar30,auVar14);
    auVar32 = vshufpd_avx(auVar31,auVar31,1);
    auVar31 = vminps_avx(auVar32,auVar31);
    auVar27 = vinsertps_avx(auVar27,auVar31,0x20);
    auVar32 = vmaxps_avx512vl(auVar34,auVar38);
    auVar31 = vshufpd_avx(auVar32,auVar32,1);
    auVar31 = vmaxps_avx(auVar31,auVar32);
    auVar37 = vmaxps_avx512vl(auVar35,auVar37);
    auVar32 = vshufpd_avx(auVar37,auVar37,1);
    auVar32 = vmaxps_avx(auVar32,auVar37);
    auVar31 = vinsertps_avx(auVar31,auVar32,0x1c);
    auVar32 = vmaxps_avx(auVar30,auVar14);
    auVar30 = vshufpd_avx(auVar32,auVar32,1);
    auVar32 = vmaxps_avx(auVar30,auVar32);
    auVar16._8_4_ = 0x7fffffff;
    auVar16._0_8_ = 0x7fffffff7fffffff;
    auVar16._12_4_ = 0x7fffffff;
    auVar30 = vandps_avx512vl(auVar33,auVar16);
    auVar31 = vinsertps_avx(auVar31,auVar32,0x20);
    auVar32 = vprolq_avx512vl(auVar30,0x20);
    auVar32 = vmaxps_avx(auVar32,auVar30);
    uVar67 = auVar32._0_4_;
    auVar71._4_4_ = uVar67;
    auVar71._0_4_ = uVar67;
    auVar71._8_4_ = uVar67;
    auVar71._12_4_ = uVar67;
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar28 = vmaxps_avx(auVar32,auVar71);
  }
  else {
    if ((int)uVar5 < 1) {
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar57._8_4_ = 0xff800000;
      auVar57._0_8_ = 0xff800000ff800000;
      auVar57._12_4_ = 0xff800000;
      auVar57._16_4_ = 0xff800000;
      auVar57._20_4_ = 0xff800000;
      auVar57._24_4_ = 0xff800000;
      auVar57._28_4_ = 0xff800000;
      auVar58 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar40 = auVar62;
      auVar42 = auVar62;
      auVar55 = auVar57;
      auVar56 = auVar57;
    }
    else {
      auVar39 = vpbroadcastd_avx512vl();
      auVar74._4_4_ = uVar67;
      auVar74._0_4_ = uVar67;
      auVar74._8_4_ = uVar67;
      auVar74._12_4_ = uVar67;
      auVar74._16_4_ = uVar67;
      auVar74._20_4_ = uVar67;
      auVar74._24_4_ = uVar67;
      auVar74._28_4_ = uVar67;
      auVar40 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar41 = vpermps_avx512vl(auVar40,ZEXT1632(auVar28));
      auVar42 = vbroadcastss_avx512vl(ZEXT416(2));
      auVar43 = vpermps_avx512vl(auVar42,ZEXT1632(auVar28));
      auVar78._4_4_ = fVar12;
      auVar78._0_4_ = fVar12;
      auVar78._8_4_ = fVar12;
      auVar78._12_4_ = fVar12;
      auVar78._16_4_ = fVar12;
      auVar78._20_4_ = fVar12;
      auVar78._24_4_ = fVar12;
      auVar78._28_4_ = fVar12;
      auVar79._4_4_ = uVar75;
      auVar79._0_4_ = uVar75;
      auVar79._8_4_ = uVar75;
      auVar79._12_4_ = uVar75;
      auVar79._16_4_ = uVar75;
      auVar79._20_4_ = uVar75;
      auVar79._24_4_ = uVar75;
      auVar79._28_4_ = uVar75;
      auVar55 = ZEXT1632(auVar31);
      auVar44 = vpermps_avx512vl(auVar40,auVar55);
      auVar69._8_4_ = 3;
      auVar69._0_8_ = 0x300000003;
      auVar69._12_4_ = 3;
      auVar69._16_4_ = 3;
      auVar69._20_4_ = 3;
      auVar69._24_4_ = 3;
      auVar69._28_4_ = 3;
      auVar45 = vpermps_avx512vl(auVar42,auVar55);
      auVar61 = vpermps_avx2(auVar69,auVar55);
      auVar46 = vbroadcastss_avx512vl(auVar27);
      auVar55 = ZEXT1632(auVar27);
      auVar47 = vpermps_avx512vl(auVar40,auVar55);
      auVar48 = vpermps_avx512vl(auVar42,auVar55);
      auVar49 = vpermps_avx512vl(auVar69,auVar55);
      auVar50 = vbroadcastss_avx512vl(auVar30);
      auVar51 = vpermps_avx512vl(auVar40,ZEXT1632(auVar30));
      auVar52 = vpermps_avx512vl(auVar42,ZEXT1632(auVar30));
      auVar53 = vbroadcastss_avx512vl(ZEXT416((uint)fVar13));
      lVar21 = uVar22 * 0x44;
      auVar60._8_4_ = 0xff800000;
      auVar60._0_8_ = 0xff800000ff800000;
      auVar60._12_4_ = 0xff800000;
      auVar60._16_4_ = 0xff800000;
      auVar60._20_4_ = 0xff800000;
      auVar60._24_4_ = 0xff800000;
      auVar60._28_4_ = 0xff800000;
      auVar76._8_4_ = 0x7f800000;
      auVar76._0_8_ = 0x7f8000007f800000;
      auVar76._12_4_ = 0x7f800000;
      auVar76._16_4_ = 0x7f800000;
      auVar76._20_4_ = 0x7f800000;
      auVar76._24_4_ = 0x7f800000;
      auVar76._28_4_ = 0x7f800000;
      auVar68 = ZEXT864(0) << 0x20;
      uVar23 = 0;
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar69 = auVar60;
      auVar18 = auVar60;
      auVar19 = auVar76;
      auVar20 = auVar76;
      do {
        auVar40 = vpbroadcastd_avx512vl();
        auVar40 = vpord_avx512vl(auVar40,_DAT_0205a920);
        uVar15 = vpcmpgtd_avx512vl(auVar39,auVar40);
        auVar40 = *(undefined1 (*) [32])(lVar21 + 0x2227bec + uVar23 * 4);
        auVar42 = *(undefined1 (*) [32])(lVar21 + 0x2228070 + uVar23 * 4);
        auVar55 = vmulps_avx512vl(auVar50,auVar42);
        auVar56 = vmulps_avx512vl(auVar51,auVar42);
        auVar57 = vmulps_avx512vl(auVar52,auVar42);
        auVar42 = vmulps_avx512vl(auVar53,auVar42);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar40,auVar46);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar40,auVar47);
        auVar57 = vfmadd231ps_avx512vl(auVar57,auVar40,auVar48);
        auVar42 = vfmadd231ps_avx512vl(auVar42,auVar49,auVar40);
        auVar40 = *(undefined1 (*) [32])(lVar21 + 0x2227768 + uVar23 * 4);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar40,auVar79);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar40,auVar44);
        auVar57 = vfmadd231ps_avx512vl(auVar57,auVar40,auVar45);
        auVar42 = vfmadd231ps_avx512vl(auVar42,auVar61,auVar40);
        auVar40 = *(undefined1 (*) [32])(bezier_basis0 + uVar23 * 4 + lVar21);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar40,auVar74);
        auVar56 = vfmadd231ps_avx512vl(auVar56,auVar40,auVar41);
        auVar58 = vfmadd231ps_avx512vl(auVar57,auVar40,auVar43);
        auVar59 = vfmadd231ps_avx512vl(auVar42,auVar78,auVar40);
        auVar40 = vminps_avx512vl(auVar19,auVar55);
        bVar10 = (byte)uVar15;
        auVar62._0_4_ =
             (uint)(bVar10 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar19._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar62._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar19._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar62._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar19._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar62._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar19._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar62._16_4_ = (uint)bVar11 * auVar40._16_4_ | (uint)!bVar11 * auVar19._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar62._20_4_ = (uint)bVar11 * auVar40._20_4_ | (uint)!bVar11 * auVar19._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar62._24_4_ = (uint)bVar11 * auVar40._24_4_ | (uint)!bVar11 * auVar19._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar62._28_4_ = (uint)bVar11 * auVar40._28_4_ | (uint)!bVar11 * auVar19._28_4_;
        auVar40 = vmaxps_avx512vl(auVar18,auVar55);
        auVar57._0_4_ =
             (uint)(bVar10 & 1) * auVar40._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar18._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar57._4_4_ = (uint)bVar11 * auVar40._4_4_ | (uint)!bVar11 * auVar18._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar57._8_4_ = (uint)bVar11 * auVar40._8_4_ | (uint)!bVar11 * auVar18._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar57._12_4_ = (uint)bVar11 * auVar40._12_4_ | (uint)!bVar11 * auVar18._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar57._16_4_ = (uint)bVar11 * auVar40._16_4_ | (uint)!bVar11 * auVar18._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar57._20_4_ = (uint)bVar11 * auVar40._20_4_ | (uint)!bVar11 * auVar18._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar57._24_4_ = (uint)bVar11 * auVar40._24_4_ | (uint)!bVar11 * auVar18._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar57._28_4_ = (uint)bVar11 * auVar40._28_4_ | (uint)!bVar11 * auVar18._28_4_;
        auVar42 = vminps_avx512vl(auVar20,auVar56);
        auVar40._0_4_ =
             (uint)(bVar10 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar20._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar40._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar20._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar40._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar20._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar40._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar20._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar40._16_4_ = (uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar20._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar40._20_4_ = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar20._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar40._24_4_ = (uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar20._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar40._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar20._28_4_;
        auVar42 = vmaxps_avx512vl(auVar69,auVar56);
        auVar55._0_4_ =
             (uint)(bVar10 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar69._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar55._4_4_ = (uint)bVar11 * auVar42._4_4_ | (uint)!bVar11 * auVar69._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar55._8_4_ = (uint)bVar11 * auVar42._8_4_ | (uint)!bVar11 * auVar69._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar55._12_4_ = (uint)bVar11 * auVar42._12_4_ | (uint)!bVar11 * auVar69._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar55._16_4_ = (uint)bVar11 * auVar42._16_4_ | (uint)!bVar11 * auVar69._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar55._20_4_ = (uint)bVar11 * auVar42._20_4_ | (uint)!bVar11 * auVar69._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar55._24_4_ = (uint)bVar11 * auVar42._24_4_ | (uint)!bVar11 * auVar69._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar55._28_4_ = (uint)bVar11 * auVar42._28_4_ | (uint)!bVar11 * auVar69._28_4_;
        auVar56 = vminps_avx512vl(auVar76,auVar58);
        auVar42._0_4_ =
             (uint)(bVar10 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar76._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar42._4_4_ = (uint)bVar11 * auVar56._4_4_ | (uint)!bVar11 * auVar76._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar42._8_4_ = (uint)bVar11 * auVar56._8_4_ | (uint)!bVar11 * auVar76._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar42._12_4_ = (uint)bVar11 * auVar56._12_4_ | (uint)!bVar11 * auVar76._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar42._16_4_ = (uint)bVar11 * auVar56._16_4_ | (uint)!bVar11 * auVar76._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar42._20_4_ = (uint)bVar11 * auVar56._20_4_ | (uint)!bVar11 * auVar76._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar42._24_4_ = (uint)bVar11 * auVar56._24_4_ | (uint)!bVar11 * auVar76._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar42._28_4_ = (uint)bVar11 * auVar56._28_4_ | (uint)!bVar11 * auVar76._28_4_;
        auVar58 = vmaxps_avx512vl(auVar60,auVar58);
        auVar56._0_4_ =
             (uint)(bVar10 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar60._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar56._4_4_ = (uint)bVar11 * auVar58._4_4_ | (uint)!bVar11 * auVar60._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar56._8_4_ = (uint)bVar11 * auVar58._8_4_ | (uint)!bVar11 * auVar60._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar56._12_4_ = (uint)bVar11 * auVar58._12_4_ | (uint)!bVar11 * auVar60._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar56._16_4_ = (uint)bVar11 * auVar58._16_4_ | (uint)!bVar11 * auVar60._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar56._20_4_ = (uint)bVar11 * auVar58._20_4_ | (uint)!bVar11 * auVar60._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar56._24_4_ = (uint)bVar11 * auVar58._24_4_ | (uint)!bVar11 * auVar60._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar56._28_4_ = (uint)bVar11 * auVar58._28_4_ | (uint)!bVar11 * auVar60._28_4_;
        vandps_avx512vl(auVar59,auVar54);
        auVar60 = vmaxps_avx512vl(auVar68._0_32_,auVar56);
        auVar58._0_4_ =
             (uint)(bVar10 & 1) * auVar60._0_4_ | (uint)!(bool)(bVar10 & 1) * auVar68._0_4_;
        bVar11 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar58._4_4_ = (uint)bVar11 * auVar60._4_4_ | (uint)!bVar11 * auVar68._4_4_;
        bVar11 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar58._8_4_ = (uint)bVar11 * auVar60._8_4_ | (uint)!bVar11 * auVar68._8_4_;
        bVar11 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar58._12_4_ = (uint)bVar11 * auVar60._12_4_ | (uint)!bVar11 * auVar68._12_4_;
        bVar11 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar58._16_4_ = (uint)bVar11 * auVar60._16_4_ | (uint)!bVar11 * auVar68._16_4_;
        bVar11 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar58._20_4_ = (uint)bVar11 * auVar60._20_4_ | (uint)!bVar11 * auVar68._20_4_;
        bVar11 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar58._24_4_ = (uint)bVar11 * auVar60._24_4_ | (uint)!bVar11 * auVar68._24_4_;
        bVar11 = SUB81(uVar15 >> 7,0);
        auVar58._28_4_ = (uint)bVar11 * auVar60._28_4_ | (uint)!bVar11 * auVar68._28_4_;
        auVar68 = ZEXT3264(auVar58);
        uVar23 = uVar23 + 8;
        auVar60 = auVar56;
        auVar69 = auVar55;
        auVar18 = auVar57;
        auVar76 = auVar42;
        auVar19 = auVar62;
        auVar20 = auVar40;
      } while (uVar23 < uVar22);
    }
    auVar61 = vshufps_avx512vl(auVar62,auVar62,0xb1);
    auVar61 = vminps_avx512vl(auVar62,auVar61);
    auVar62 = vshufpd_avx(auVar61,auVar61,5);
    auVar62 = vminps_avx(auVar61,auVar62);
    auVar27 = vminps_avx(auVar62._0_16_,auVar62._16_16_);
    auVar62 = vshufps_avx512vl(auVar40,auVar40,0xb1);
    auVar62 = vminps_avx512vl(auVar40,auVar62);
    auVar40 = vshufpd_avx(auVar62,auVar62,5);
    auVar40 = vminps_avx(auVar62,auVar40);
    auVar31 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar31 = vunpcklps_avx(auVar27,auVar31);
    auVar40 = vshufps_avx(auVar42,auVar42,0xb1);
    auVar40 = vminps_avx(auVar42,auVar40);
    auVar42 = vshufpd_avx(auVar40,auVar40,5);
    auVar40 = vminps_avx(auVar40,auVar42);
    auVar27 = vminps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar27 = vinsertps_avx(auVar31,auVar27,0x28);
    auVar40 = vshufps_avx(auVar57,auVar57,0xb1);
    auVar40 = vmaxps_avx(auVar57,auVar40);
    auVar42 = vshufpd_avx(auVar40,auVar40,5);
    auVar40 = vmaxps_avx(auVar40,auVar42);
    auVar31 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar40 = vshufps_avx(auVar55,auVar55,0xb1);
    auVar40 = vmaxps_avx(auVar55,auVar40);
    auVar42 = vshufpd_avx(auVar40,auVar40,5);
    auVar40 = vmaxps_avx(auVar40,auVar42);
    auVar32 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar32 = vunpcklps_avx(auVar31,auVar32);
    auVar40 = vshufps_avx(auVar56,auVar56,0xb1);
    auVar40 = vmaxps_avx(auVar56,auVar40);
    auVar42 = vshufpd_avx(auVar40,auVar40,5);
    auVar40 = vmaxps_avx(auVar40,auVar42);
    auVar31 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar31 = vinsertps_avx(auVar32,auVar31,0x28);
    auVar40 = vshufps_avx(auVar58,auVar58,0xb1);
    auVar40 = vmaxps_avx(auVar58,auVar40);
    auVar42 = vshufpd_avx(auVar40,auVar40,5);
    auVar40 = vmaxps_avx(auVar40,auVar42);
    auVar32 = vmaxps_avx(auVar40._0_16_,auVar40._16_16_);
    auVar28._0_4_ = auVar32._0_4_;
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = auVar28._0_4_;
    auVar28._12_4_ = auVar28._0_4_;
  }
  auVar32 = vminps_avx(auVar27,auVar29);
  auVar27 = vmaxps_avx(auVar31,auVar29);
  auVar63._4_4_ = fVar13;
  auVar63._0_4_ = fVar13;
  auVar63._8_4_ = fVar13;
  auVar63._12_4_ = fVar13;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar29 = vandps_avx512vl(auVar63,auVar17);
  auVar29 = vmaxps_avx(auVar28,auVar29);
  auVar31 = vsubps_avx(auVar32,auVar29);
  auVar64._0_4_ = auVar27._0_4_ + auVar29._0_4_;
  auVar64._4_4_ = auVar27._4_4_ + auVar29._4_4_;
  auVar64._8_4_ = auVar27._8_4_ + auVar29._8_4_;
  auVar64._12_4_ = auVar27._12_4_ + auVar29._12_4_;
  auVar65._8_4_ = 0x7fffffff;
  auVar65._0_8_ = 0x7fffffff7fffffff;
  auVar65._12_4_ = 0x7fffffff;
  auVar27 = vandps_avx(auVar31,auVar65);
  auVar29 = vandps_avx(auVar64,auVar65);
  auVar27 = vmaxps_avx(auVar27,auVar29);
  auVar29 = vmovshdup_avx(auVar27);
  auVar29 = vmaxss_avx(auVar29,auVar27);
  auVar27 = vshufpd_avx(auVar27,auVar27,1);
  auVar27 = vmaxss_avx(auVar27,auVar29);
  fVar1 = auVar27._0_4_ * 4.7683716e-07;
  auVar66._4_4_ = fVar1;
  auVar66._0_4_ = fVar1;
  auVar66._8_4_ = fVar1;
  auVar66._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar31,auVar66);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar64._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar64._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar64._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar64._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const LinearSpace3fa& space, size_t i) const {
        return bounds(space,i);
      }